

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlParserCtxtPtr xmlCreateMemoryParserCtxt(char *buffer,int size)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr value;
  
  if (-1 < size) {
    ctxt = xmlNewParserCtxt();
    if (ctxt != (xmlParserCtxtPtr)0x0) {
      value = xmlCtxtNewInputFromMemory(ctxt,(char *)0x0,buffer,(ulong)(uint)size,(char *)0x0,0);
      if (value != (xmlParserInputPtr)0x0) {
        iVar1 = xmlCtxtPushInput(ctxt,value);
        if (-1 < iVar1) {
          return ctxt;
        }
        xmlFreeInputStream(value);
      }
      xmlFreeParserCtxt(ctxt);
    }
  }
  return (xmlParserCtxtPtr)0x0;
}

Assistant:

xmlParserCtxtPtr
xmlCreateMemoryParserCtxt(const char *buffer, int size) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    if (size < 0)
	return(NULL);

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    input = xmlCtxtNewInputFromMemory(ctxt, NULL, buffer, size, NULL, 0);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    return(ctxt);
}